

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O0

int SHA224_256ResultN(SHA256Context *context,uint8_t *Message_Digest,int HashSize)

{
  int local_24;
  int local_20;
  int i;
  int result;
  int HashSize_local;
  uint8_t *Message_Digest_local;
  SHA256Context *context_local;
  
  if ((context == (SHA256Context *)0x0) || (Message_Digest == (uint8_t *)0x0)) {
    local_20 = 1;
  }
  else if (context->Corrupted == 0) {
    if (context->Computed == 0) {
      SHA224_256Finalize(context,0x80);
    }
    for (local_24 = 0; local_24 < HashSize; local_24 = local_24 + 1) {
      Message_Digest[local_24] =
           (uint8_t)(context->Intermediate_Hash[local_24 >> 2] >>
                    (('\x03' - ((byte)local_24 & 3)) * '\b' & 0x1f));
    }
    local_20 = 0;
  }
  else {
    local_20 = context->Corrupted;
  }
  return local_20;
}

Assistant:

static int SHA224_256ResultN(SHA256Context *context, uint8_t Message_Digest[], int HashSize)
{
    int result;
    int i;

    if (!context || !Message_Digest)
    {
        result = shaNull;
    }
    else if (context->Corrupted)
    {
        result = context->Corrupted;
    }
    else
    {
        if (!context->Computed)
        {
            SHA224_256Finalize(context, 0x80);
        }
        for (i = 0; i < HashSize; ++i)
        {
            Message_Digest[i] = (uint8_t)(context->Intermediate_Hash[i >> 2] >> 8 * (3 - (i & 0x03)));
        }
        result = shaSuccess;
    }
    return result;
}